

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rounded_box.cxx
# Opt level: O3

void rbox(int fill,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  iVar1 = (w * 2) / 5;
  iVar2 = (h * 2) / 5;
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  iVar1 = 0xf;
  if (iVar2 < 0xf) {
    iVar1 = iVar2;
  }
  iVar3 = 4;
  if (iVar2 != 5) {
    iVar3 = iVar1;
  }
  iVar1 = 8;
  if (iVar3 != 7) {
    iVar1 = iVar3;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(fill != 0) + 0x1a])();
  dVar7 = (double)iVar1;
  pdVar4 = offset + 4;
  lVar5 = 0;
  do {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              (*pdVar4 * dVar7 + (double)x + 0.5,
               *(double *)((long)offset + lVar5) * dVar7 + (double)y + 0.5);
    pdVar4 = pdVar4 + -1;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x28);
  dVar8 = (double)(h + y + -1);
  pdVar4 = offset + 4;
  lVar5 = 0;
  do {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              (*(double *)((long)offset + lVar5) * dVar7 + (double)x + 0.5,
               (dVar8 - *pdVar4 * dVar7) + 0.5);
    lVar5 = lVar5 + 8;
    pdVar4 = pdVar4 + -1;
  } while (lVar5 != 0x28);
  dVar6 = (double)(w + x + -1);
  pdVar4 = offset + 4;
  lVar5 = 0;
  do {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              ((dVar6 - *pdVar4 * dVar7) + 0.5,
               (dVar8 - *(double *)((long)offset + lVar5) * dVar7) + 0.5);
    pdVar4 = pdVar4 + -1;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x28);
  pdVar4 = offset + 4;
  lVar5 = 0;
  do {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              ((dVar6 - *(double *)((long)offset + lVar5) * dVar7) + 0.5,
               *pdVar4 * dVar7 + (double)y + 0.5);
    lVar5 = lVar5 + 8;
    pdVar4 = pdVar4 + -1;
  } while (lVar5 != 0x28);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(fill != 0) + 0x24])();
  return;
}

Assistant:

static void rbox(int fill, int x, int y, int w, int h) {
  int i;
  int rs, rsy;
  rs = w*2/5; rsy = h*2/5;
  if (rs > rsy) rs = rsy; // use smaller radius
  if (rs > RS) rs = RS;
  if (rs == 5) rs = 4;	// use only even sizes for small corners (STR #2943)
  if (rs == 7) rs = 8;	// note: 8 is better than 6 (really)

  if (fill) fl_begin_polygon(); else fl_begin_loop();
  for (i=0; i<RN; i++)
    fl_vertex_r(x + offset[RN-i-1]*rs, y + offset[i] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + offset[i]*rs, y + h-1 - offset[RN-i-1] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + w-1 - offset[RN-i-1]*rs, y + h-1 - offset[i] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + w-1 - offset[i]*rs, y + offset[RN-i-1] * rs);
  if (fill) fl_end_polygon(); else fl_end_loop();
}